

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

char * escapize_string(char *str)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  
  if (str != (char *)0x0) {
    sVar3 = strlen(str);
    uVar8 = (uint)sVar3;
    if (uVar8 != 0) {
      if ((int)uVar8 < 1) {
        uVar6 = 4;
      }
      else {
        uVar6 = 4;
        uVar5 = 0;
        do {
          bVar1 = str[uVar5];
          if (bVar1 < 0x26) {
            if (((bVar1 != 10) && (bVar1 != 0xd)) && (bVar1 != 0x22)) goto LAB_00114134;
LAB_0011411c:
            iVar2 = 6;
          }
          else if (bVar1 < 0x3c) {
            iVar2 = 5;
            if (bVar1 != 0x26) {
              if (bVar1 == 0x27) goto LAB_0011411c;
LAB_00114134:
              iVar2 = 1;
            }
          }
          else {
            if ((bVar1 != 0x3e) && (bVar1 != 0x3c)) goto LAB_00114134;
            iVar2 = 4;
          }
          uVar6 = uVar6 + iVar2;
          uVar5 = uVar5 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar5);
      }
      lVar7 = 1;
      pcVar4 = (char *)calloc(1,(long)(int)uVar6);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
        fprintf(_stderr,"** escapize_string: failed to alloc %d bytes\n",(ulong)uVar6);
      }
      else {
        *pcVar4 = '\'';
        if (0 < (int)uVar8) {
          iVar2 = 1;
          uVar5 = 0;
          do {
            bVar1 = str[uVar5];
            if (bVar1 < 0x26) {
              if (bVar1 == 10) {
                (pcVar4 + (long)iVar2 + 4)[0] = 'a';
                (pcVar4 + (long)iVar2 + 4)[1] = ';';
                builtin_strncpy(pcVar4 + iVar2,"&#x0",4);
              }
              else if (bVar1 == 0xd) {
                (pcVar4 + (long)iVar2 + 4)[0] = 'd';
                (pcVar4 + (long)iVar2 + 4)[1] = ';';
                builtin_strncpy(pcVar4 + iVar2,"&#x0",4);
              }
              else {
                if (bVar1 != 0x22) goto LAB_00114218;
                (pcVar4 + (long)iVar2 + 4)[0] = 't';
                (pcVar4 + (long)iVar2 + 4)[1] = ';';
                builtin_strncpy(pcVar4 + iVar2,"&quo",4);
              }
LAB_0011425c:
              iVar2 = iVar2 + 6;
            }
            else if (bVar1 < 0x3c) {
              if (bVar1 == 0x26) {
                pcVar4[(long)iVar2 + 4] = ';';
                builtin_strncpy(pcVar4 + iVar2,"&amp",4);
                iVar2 = iVar2 + 5;
              }
              else {
                if (bVar1 == 0x27) {
                  (pcVar4 + (long)iVar2 + 4)[0] = 's';
                  (pcVar4 + (long)iVar2 + 4)[1] = ';';
                  builtin_strncpy(pcVar4 + iVar2,"&apo",4);
                  goto LAB_0011425c;
                }
LAB_00114218:
                lVar7 = (long)iVar2;
                iVar2 = iVar2 + 1;
                pcVar4[lVar7] = bVar1;
              }
            }
            else {
              if (bVar1 == 0x3c) {
                builtin_strncpy(pcVar4 + iVar2,"&lt;",4);
              }
              else {
                if (bVar1 != 0x3e) goto LAB_00114218;
                builtin_strncpy(pcVar4 + iVar2,"&gt;",4);
              }
              iVar2 = iVar2 + 4;
            }
            uVar5 = uVar5 + 1;
          } while ((uVar8 & 0x7fffffff) != uVar5);
          lVar7 = (long)iVar2;
        }
        (pcVar4 + lVar7)[0] = '\'';
        (pcVar4 + lVar7)[1] = '\0';
      }
      return pcVar4;
    }
  }
  pcVar4 = nifti_strdup("\'\'");
  return pcVar4;
}

Assistant:

static char *escapize_string( const char * str )
{
   int ii,jj , lstr,lout ;
   char *out ;

   if( str == NULL || (lstr=(int)strlen(str)) == 0 ){      /* 0 length */
     out = nifti_strdup("''") ; return out ;                /* string?? */
   }

   lout = 4 ;                      /* initialize length of output */
   for( ii=0 ; ii < lstr ; ii++ ){ /* count characters for output */
     switch( str[ii] ){
       case '&':  lout += 5 ; break ;  /* replace '&' with "&amp;" */

       case '<':
       case '>':  lout += 4 ; break ;  /* replace '<' with "&lt;" */

       case '"' :
       case '\'': lout += 6 ; break ;  /* replace '"' with "&quot;" */

       case CR:
       case LF:   lout += 6 ; break ;  /* replace CR with "&#x0d;"
                                                  LF with "&#x0a;" */

       default: lout++ ; break ;      /* copy all other chars */
     }
   }
   out = (char *)calloc(1,lout) ;     /* allocate output string */
   if( !out ){
      fprintf(stderr,"** escapize_string: failed to alloc %d bytes\n",lout);
      return NULL;
   }
   out[0] = '\'' ;                    /* opening quote mark */
   for( ii=0,jj=1 ; ii < lstr ; ii++ ){
      switch( str[ii] ){
         default: out[jj++] = str[ii] ; break ;  /* normal characters */

         case '&':  memcpy(out+jj,"&amp;",5)  ; jj+=5 ; break ;

         case '<':  memcpy(out+jj,"&lt;",4)   ; jj+=4 ; break ;
         case '>':  memcpy(out+jj,"&gt;",4)   ; jj+=4 ; break ;

         case '"' : memcpy(out+jj,"&quot;",6) ; jj+=6 ; break ;

         case '\'': memcpy(out+jj,"&apos;",6) ; jj+=6 ; break ;

         case CR:   memcpy(out+jj,"&#x0d;",6) ; jj+=6 ; break ;
         case LF:   memcpy(out+jj,"&#x0a;",6) ; jj+=6 ; break ;
      }
   }
   out[jj++] = '\''  ;  /* closing quote mark */
   out[jj]   = '\0' ;  /* terminate the string */
   return out ;
}